

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::transposeTransitionMatrices
          (BeagleCPUImpl<float,_1,_0> *this,int *inputIndices,int *resultIndices,int matrixCount)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  float **ppfVar4;
  int i;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  float *pfVar8;
  uint uVar9;
  long lVar10;
  float *pfVar11;
  float *pfVar12;
  ulong uVar13;
  float *pfVar14;
  
  uVar1 = this->kCategoryCount;
  ppfVar4 = this->gTransitionMatrices;
  uVar7 = 0;
  while( true ) {
    if (uVar7 == (uint)(~(matrixCount >> 0x1f) & matrixCount)) {
      return 0;
    }
    if (inputIndices[uVar7] == resultIndices[uVar7]) break;
    uVar2 = this->kStateCount;
    pfVar11 = ppfVar4[resultIndices[uVar7]];
    pfVar8 = ppfVar4[inputIndices[uVar7]];
    iVar6 = this->kTransPaddedStateCount * uVar2;
    for (uVar9 = 0; uVar9 != (~((int)uVar1 >> 0x1f) & uVar1); uVar9 = uVar9 + 1) {
      lVar10 = 0;
      pfVar12 = pfVar11;
      for (uVar5 = 0; uVar5 != (~((int)uVar2 >> 0x1f) & uVar2); uVar5 = uVar5 + 1) {
        iVar3 = this->kTransPaddedStateCount;
        pfVar14 = pfVar12;
        for (uVar13 = 0; uVar2 != uVar13; uVar13 = uVar13 + 1) {
          *pfVar14 = *(float *)((long)pfVar8 + uVar13 * 4 + lVar10 * iVar3);
          pfVar14 = pfVar14 + iVar3;
        }
        lVar10 = lVar10 + 4;
        pfVar12 = pfVar12 + 1;
      }
      pfVar8 = pfVar8 + iVar6;
      pfVar11 = pfVar11 + iVar6;
    }
    uVar7 = uVar7 + 1;
  }
  return -5;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::transposeTransitionMatrices(
        const int* inputIndices,
        const int* resultIndices,
        int matrixCount) {

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Entering BeagleCPUImpl::transposeTransitionMatrices \n");
#endif

    int returnCode = BEAGLE_SUCCESS;

    for (int u = 0; u < matrixCount; u++) {

        if (inputIndices[u] == resultIndices[u]) {

#ifdef BEAGLE_DEBUG_FLOW
            fprintf(stderr, "In-place transpose is not allowed.\n");
#endif

            returnCode = BEAGLE_ERROR_OUT_OF_RANGE;
            break;

        }

        REALTYPE* A = gTransitionMatrices[inputIndices[u]];
        REALTYPE* C = gTransitionMatrices[resultIndices[u]];

        for (int l = 0; l < kCategoryCount; l++) {

            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {

                    C[kTransPaddedStateCount * j + i] = A[kTransPaddedStateCount * i + j];

                }
            }

            A += kStateCount * kTransPaddedStateCount;
            C += kStateCount * kTransPaddedStateCount;
        }
    }

#ifdef BEAGLE_DEBUG_FLOW
    fprintf(stderr, "\t Leaving BeagleCPUImpl::transposeTransitionMatrices \n");
#endif

    return returnCode;
}